

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

void __thiscall google::protobuf::internal::ExtensionSet::RemoveLast(ExtensionSet *this,int number)

{
  Extension *pEVar1;
  LogMessage *pLVar2;
  LogFinisher local_49;
  LogMessage local_48;
  
  pEVar1 = FindOrNull(this,number);
  if (pEVar1 == (Extension *)0x0) {
    LogMessage::LogMessage
              (&local_48,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/extension_set.cc"
               ,799);
    pLVar2 = LogMessage::operator<<(&local_48,"CHECK failed: extension != NULL: ");
    pLVar2 = LogMessage::operator<<(pLVar2,"Index out-of-bounds (field is empty).");
    LogFinisher::operator=(&local_49,pLVar2);
    LogMessage::~LogMessage(&local_48);
  }
  switch(*(undefined4 *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)pEVar1->type * 4)) {
  case 1:
  case 2:
  case 3:
  case 4:
  case 5:
  case 6:
  case 7:
  case 8:
    ((pEVar1->field_0).repeated_int32_value)->current_size_ =
         ((pEVar1->field_0).repeated_int32_value)->current_size_ + -1;
    break;
  case 9:
    RepeatedPtrFieldBase::
    RemoveLast<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
              ((RepeatedPtrFieldBase *)(pEVar1->field_0).string_value);
    break;
  case 10:
    RepeatedPtrFieldBase::
    RemoveLast<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>::TypeHandler>
              ((RepeatedPtrFieldBase *)(pEVar1->field_0).string_value);
  }
  return;
}

Assistant:

void ExtensionSet::RemoveLast(int number) {
  Extension* extension = FindOrNull(number);
  GOOGLE_CHECK(extension != NULL) << "Index out-of-bounds (field is empty).";
  GOOGLE_DCHECK(extension->is_repeated);

  switch (cpp_type(extension->type)) {
    case WireFormatLite::CPPTYPE_INT32:
      extension->repeated_int32_value->RemoveLast();
      break;
    case WireFormatLite::CPPTYPE_INT64:
      extension->repeated_int64_value->RemoveLast();
      break;
    case WireFormatLite::CPPTYPE_UINT32:
      extension->repeated_uint32_value->RemoveLast();
      break;
    case WireFormatLite::CPPTYPE_UINT64:
      extension->repeated_uint64_value->RemoveLast();
      break;
    case WireFormatLite::CPPTYPE_FLOAT:
      extension->repeated_float_value->RemoveLast();
      break;
    case WireFormatLite::CPPTYPE_DOUBLE:
      extension->repeated_double_value->RemoveLast();
      break;
    case WireFormatLite::CPPTYPE_BOOL:
      extension->repeated_bool_value->RemoveLast();
      break;
    case WireFormatLite::CPPTYPE_ENUM:
      extension->repeated_enum_value->RemoveLast();
      break;
    case WireFormatLite::CPPTYPE_STRING:
      extension->repeated_string_value->RemoveLast();
      break;
    case WireFormatLite::CPPTYPE_MESSAGE:
      extension->repeated_message_value->RemoveLast();
      break;
  }
}